

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O2

int ffbinit(fitsfile *fptr,int *status)

{
  char cVar1;
  int iVar2;
  int iVar3;
  FITSfile *pFVar4;
  tcolumn *ptVar5;
  size_t sVar6;
  int *piVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  LONGLONG rowlen;
  long tfield;
  LONGLONG nrows;
  LONGLONG pcount;
  LONGLONG totalwidth;
  char name [75];
  char value [71];
  char comm [73];
  char message [81];
  
  if (0 < *status) {
    return *status;
  }
  pFVar4 = fptr->Fptr;
  if (fptr->HDUposition != pFVar4->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    pFVar4 = fptr->Fptr;
  }
  pFVar4->hdutype = 2;
  pFVar4->headend = pFVar4->logfilesize;
  iVar2 = ffgttb(fptr,&rowlen,&nrows,&pcount,&tfield,status);
  if (iVar2 < 1) {
    pFVar4 = fptr->Fptr;
    pFVar4->rowlength = rowlen;
    pFVar4->tfield = (int)tfield;
    if (pFVar4->tilerow != (int *)0x0) {
      uVar12 = (int)((pFVar4->znaxis[0] + -1) / pFVar4->tilesize[0]) + 1;
      uVar10 = 0;
      uVar13 = (ulong)uVar12;
      if ((int)uVar12 < 1) {
        uVar13 = uVar10;
      }
      for (; uVar13 != uVar10; uVar10 = uVar10 + 1) {
        free(fptr->Fptr->tiledata[uVar10]);
        free(fptr->Fptr->tilenullarray[uVar10]);
      }
      free(fptr->Fptr->tileanynull);
      free(fptr->Fptr->tiletype);
      free(fptr->Fptr->tiledatasize);
      free(fptr->Fptr->tilenullarray);
      free(fptr->Fptr->tiledata);
      free(fptr->Fptr->tilerow);
      pFVar4 = fptr->Fptr;
      pFVar4->tilenullarray = (void **)0x0;
      pFVar4->tileanynull = (int *)0x0;
      pFVar4->tiletype = (int *)0x0;
      pFVar4->tiledata = (void **)0x0;
      pFVar4->tilerow = (int *)0x0;
      pFVar4->tiledatasize = (long *)0x0;
    }
    free(pFVar4->tableptr);
    sVar6 = CONCAT44(tfield._4_4_,(int)tfield);
    if ((long)sVar6 < 1) {
      ptVar5 = (tcolumn *)0x0;
    }
    else {
      ptVar5 = (tcolumn *)calloc(sVar6,0xa0);
      if (ptVar5 == (tcolumn *)0x0) {
        ffpmsg("malloc failed to get memory for FITS table descriptors (ffbinit)");
        fptr->Fptr->tableptr = (tcolumn *)0x0;
        *status = 0x6f;
        return 0x6f;
      }
    }
    pFVar4 = fptr->Fptr;
    pFVar4->tableptr = ptVar5;
    if ((long)sVar6 < 1) {
      sVar6 = 0;
    }
    while (sVar6 != 0) {
      ptVar5->ttype[0] = '\0';
      ptVar5->tscale = 1.0;
      ptVar5->tzero = 0.0;
      ptVar5->tnull = 0x4995cdd1;
      ptVar5->tdatatype = -9999;
      ptVar5->trepeat = 1;
      ptVar5->strnull[0] = '\0';
      ptVar5 = ptVar5 + 1;
      sVar6 = sVar6 - 1;
    }
    pFVar4->numrows = nrows;
    pFVar4->origrows = nrows;
    pFVar4->heapstart = nrows * rowlen;
    pFVar4->heapsize = pcount;
    pFVar4->compressimg = 0;
    iVar2 = 8;
    iVar11 = 0;
    do {
      ffgkyn(fptr,iVar2,name,value,comm,status);
      iVar3 = *status;
      if (iVar3 == 0xcd) {
        sVar6 = strlen(value);
        (value + sVar6)[0] = '\'';
        (value + sVar6)[1] = '\0';
LAB_00146e94:
        *status = 0;
      }
      else {
        if (iVar3 == 0xcf) goto LAB_00146e94;
        if (iVar3 == 0x6b) {
          ffpmsg("END keyword not found in binary table header (ffbinit).");
          *status = 0xd2;
          return 0xd2;
        }
        if (0 < iVar3) {
          return iVar3;
        }
      }
      cVar1 = name[0];
      if ((name._0_4_ & 0xff) == 0x5a) {
        iVar3 = bcmp(name,"ZIMAGE",7);
        if (iVar3 != 0) goto LAB_00146eda;
        uVar12 = 0x5a;
        if (value[0] == 'T') {
          fptr->Fptr->compressimg = 1;
        }
      }
      else if ((name._0_4_ & 0xff) == 0x54) {
        ffgtbp(fptr,name,value,status);
        uVar12 = name._0_4_ & 0xff;
      }
      else {
LAB_00146eda:
        uVar12 = name._0_4_;
        if (cVar1 == 'E' && name._0_4_ == 0x444e45) goto LAB_00146f2e;
      }
      iVar11 = iVar11 + 1;
      if (((char)uVar12 != '\0' || value[0] != '\0') || comm[0] != '\0') {
        iVar11 = 0;
      }
      iVar2 = iVar2 + 1;
    } while( true );
  }
LAB_00146c5f:
  return *status;
LAB_00146f2e:
  pFVar4 = fptr->Fptr;
  lVar8 = 0;
  lVar9 = CONCAT44(tfield._4_4_,(int)tfield);
  if (CONCAT44(tfield._4_4_,(int)tfield) < 1) {
    lVar9 = lVar8;
  }
  piVar7 = &pFVar4->tableptr->tdatatype;
  for (; lVar9 != lVar8; lVar8 = lVar8 + 1) {
    if (*piVar7 == -9999) {
      ffkeyn("TFORM",(int)lVar8 + 1,name,status);
      snprintf(message,0x51,"Required %s keyword not found (ffbinit).",name);
      ffpmsg(message);
      *status = 0xe8;
      return 0xe8;
    }
    piVar7 = piVar7 + 0x28;
  }
  lVar9 = pFVar4->nextkey;
  pFVar4->headend = lVar9 - (iVar11 * 0x50 + 0x50);
  lVar9 = lVar9 - (lVar9 + -0x50) % 0xb40;
  pFVar4->datastart = lVar9 + 0xaf0;
  lVar8 = pFVar4->heapsize + pFVar4->heapstart;
  pFVar4->headstart[(long)pFVar4->curhdu + 1] = (lVar8 + lVar9 + 0x162f) - (lVar8 + 0xb3f) % 0xb40;
  ffgtbc(fptr,&totalwidth,status);
  if (totalwidth != rowlen) {
    snprintf(message,0x51,"NAXIS1 = %ld is not equal to the sum of column widths: %ld");
    ffpmsg(message);
    *status = 0xf1;
  }
  pFVar4 = fptr->Fptr;
  pFVar4->nextkey = pFVar4->headstart[pFVar4->curhdu];
  if (pFVar4->compressimg == 1) {
    imcomp_get_compressed_image_par(fptr,status);
  }
  goto LAB_00146c5f;
}

Assistant:

int ffbinit(fitsfile *fptr,     /* I - FITS file pointer */
            int *status)        /* IO - error status     */
{
/*
  initialize the parameters defining the structure of a binary table 
*/
    int  ii, nspace, ntilebins;
    long tfield;
    LONGLONG pcount, rowlen, nrows, totalwidth;
    tcolumn *colptr = 0;
    char name[FLEN_KEYWORD], value[FLEN_VALUE], comm[FLEN_COMMENT];
    char message[FLEN_ERRMSG];

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    (fptr->Fptr)->hdutype = BINARY_TBL;  /* set that this is a binary table */
    (fptr->Fptr)->headend = (fptr->Fptr)->logfilesize;  /* set max size */

    /* get table parameters and test that the header is valid: */
    if (ffgttb(fptr, &rowlen, &nrows, &pcount, &tfield, status) > 0)
       return(*status);

    (fptr->Fptr)->rowlength =  rowlen; /* store length of a row */
    (fptr->Fptr)->tfield = tfield; /* store number of table fields in row */

     /* free the tile-compressed image cache, if it exists */
     if ((fptr->Fptr)->tilerow) {

           ntilebins = 
	    (((fptr->Fptr)->znaxis[0] - 1) / ((fptr->Fptr)->tilesize[0])) + 1;

           for (ii = 0; ii < ntilebins; ii++) {
             if ((fptr->Fptr)->tiledata[ii]) {
	       free((fptr->Fptr)->tiledata[ii]);
             }

             if ((fptr->Fptr)->tilenullarray[ii]) {
	       free((fptr->Fptr)->tilenullarray[ii]);
             }
            }
	    
	    free((fptr->Fptr)->tileanynull);
	    free((fptr->Fptr)->tiletype);	   
	    free((fptr->Fptr)->tiledatasize);
	    free((fptr->Fptr)->tilenullarray);
	    free((fptr->Fptr)->tiledata);
	    free((fptr->Fptr)->tilerow);

	    (fptr->Fptr)->tileanynull = 0;
	    (fptr->Fptr)->tiletype = 0;	   
	    (fptr->Fptr)->tiledatasize = 0;
	    (fptr->Fptr)->tilenullarray = 0;
	    (fptr->Fptr)->tiledata = 0;
	    (fptr->Fptr)->tilerow = 0;
     }

    if ((fptr->Fptr)->tableptr)
       free((fptr->Fptr)->tableptr); /* free memory for the old CHDU */

    /* mem for column structures ; space is initialized = 0  */
    if (tfield > 0)
    {
      colptr = (tcolumn *) calloc(tfield, sizeof(tcolumn) );
      if (!colptr)
      {
        ffpmsg
        ("malloc failed to get memory for FITS table descriptors (ffbinit)");
        (fptr->Fptr)->tableptr = 0;  /* set a null table structure pointer */
        return(*status = ARRAY_TOO_BIG);
      }
    }

    /* copy the table structure address to the fitsfile structure */
    (fptr->Fptr)->tableptr = colptr; 

    /* initialize the table field parameters */
    for (ii = 0; ii < tfield; ii++, colptr++)
    {
        colptr->ttype[0] = '\0';  /* null column name */
        colptr->tscale = 1.;
        colptr->tzero  = 0.;
        colptr->tnull  = NULL_UNDEFINED; /* (integer) null value undefined */
        colptr->tdatatype = -9999;   /* initialize to illegal value */
        colptr->trepeat = 1;
        colptr->strnull[0] = '\0'; /* for ASCII string columns (TFORM = rA) */
    }

    /*
      Initialize the heap starting address (immediately following
      the table data) and the size of the heap.  This is used to find the
      end of the table data when checking the fill values in the last block. 
    */
    (fptr->Fptr)->numrows = nrows;
    (fptr->Fptr)->origrows = nrows;
    (fptr->Fptr)->heapstart = rowlen * nrows;
    (fptr->Fptr)->heapsize = pcount;

    (fptr->Fptr)->compressimg = 0;  /* initialize as not a compressed image */

    /* now search for the table column keywords and the END keyword */

    for (nspace = 0, ii = 8; 1; ii++)  /* infinite loop  */
    {
        ffgkyn(fptr, ii, name, value, comm, status);

        /* try to ignore minor syntax errors */
        if (*status == NO_QUOTE)
        {
            strcat(value, "'");
            *status = 0;
        }
        else if (*status == BAD_KEYCHAR)
        {
            *status = 0;
        }

        if (*status == END_OF_FILE)
        {
            ffpmsg("END keyword not found in binary table header (ffbinit).");
            return(*status = NO_END);
        }
        else if (*status > 0)
            return(*status);

        else if (name[0] == 'T')   /* keyword starts with 'T' ? */
            ffgtbp(fptr, name, value, status); /* test if column keyword */

        else if (!FSTRCMP(name, "ZIMAGE"))
        {
            if (value[0] == 'T')
                (fptr->Fptr)->compressimg = 1; /* this is a compressed image */
        }
        else if (!FSTRCMP(name, "END"))  /* is this the END keyword? */
            break;


        if (!name[0] && !value[0] && !comm[0])  /* a blank keyword? */
            nspace++;

        else
            nspace = 0; /* reset number of consecutive spaces before END */
    }

    /* test that all the required keywords were found and have legal values */
    colptr = (fptr->Fptr)->tableptr;  /* set pointer to first column */

    for (ii = 0; ii < tfield; ii++, colptr++)
    {
        if (colptr->tdatatype == -9999)
        {
            ffkeyn("TFORM", ii+1, name, status);  /* construct keyword name */
            snprintf(message,FLEN_ERRMSG,"Required %s keyword not found (ffbinit).", name);
            ffpmsg(message);
            return(*status = NO_TFORM);
        }
    }

    /*
      now we know everything about the table; just fill in the parameters:
      the 'END' record is 80 bytes before the current position, minus
      any trailing blank keywords just before the END keyword.
    */

    (fptr->Fptr)->headend = (fptr->Fptr)->nextkey - (80 * (nspace + 1));
 
    /* the data unit begins at the beginning of the next logical block */
    (fptr->Fptr)->datastart = (((fptr->Fptr)->nextkey - 80) / 2880 + 1) 
                              * 2880;

    /* the next HDU begins in the next logical block after the data  */
    (fptr->Fptr)->headstart[ (fptr->Fptr)->curhdu + 1] = 
         (fptr->Fptr)->datastart +
	 ( ((fptr->Fptr)->heapstart + (fptr->Fptr)->heapsize + 2879) / 2880 * 2880 );

    /* determine the byte offset to the beginning of each column */
    ffgtbc(fptr, &totalwidth, status);

    if (totalwidth != rowlen)
    {
        snprintf(message,FLEN_ERRMSG,
        "NAXIS1 = %ld is not equal to the sum of column widths: %ld", 
        (long) rowlen, (long) totalwidth);
        ffpmsg(message);
        *status = BAD_ROW_WIDTH;
    }

    /* reset next keyword pointer to the start of the header */
    (fptr->Fptr)->nextkey = (fptr->Fptr)->headstart[ (fptr->Fptr)->curhdu ];

    if ( (fptr->Fptr)->compressimg == 1) /*  Is this a compressed image */
        imcomp_get_compressed_image_par(fptr, status);

    return(*status);
}